

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O0

void __thiscall amrex::ForkJoin::copy_data_from_tasks(ForkJoin *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  Long LVar5;
  ComponentSet *pCVar6;
  byte *in_RDI;
  int task_comp_n;
  int i;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *forked;
  Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_> *comp_split;
  MultiFab *orig;
  MFFork *mff;
  int idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *mf_name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>
  *p;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  *__range1;
  FabArrayBase *in_stack_fffffffffffffa18;
  Print *in_stack_fffffffffffffa20;
  Print *in_stack_fffffffffffffa28;
  Print *in_stack_fffffffffffffa30;
  Print *in_stack_fffffffffffffa38;
  Print *in_stack_fffffffffffffa40;
  ostream *in_stack_fffffffffffffa48;
  Print *in_stack_fffffffffffffa50;
  Print *in_stack_fffffffffffffa90;
  ostream local_510 [396];
  int local_384;
  int local_1f4;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *local_1f0;
  Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_> *local_1e8;
  FabArrayBase *local_1e0;
  MFFork *local_1d8;
  int local_1cc;
  reference local_1c8;
  reference local_1c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_true>
  local_1b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_true>
  local_1b0;
  byte *local_1a8;
  
  if ((*in_RDI & 1) != 0) {
    OutStream();
    Print::Print(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    Print::operator<<(in_stack_fffffffffffffa20,(char (*) [41])in_stack_fffffffffffffa18);
    Print::~Print(in_stack_fffffffffffffa90);
  }
  local_1a8 = in_RDI + 0x58;
  local_1b0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
                *)in_stack_fffffffffffffa18);
  local_1b8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
              *)in_stack_fffffffffffffa18);
  while (bVar2 = std::__detail::operator!=(&local_1b0,&local_1b8), bVar2) {
    local_1c8 = std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_false,_true>
                ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_false,_true>
                             *)0x1212e75);
    local_1c0 = local_1c8;
    for (local_1cc = 0; lVar4 = (long)local_1cc,
        LVar5 = Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::size
                          ((Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                            *)0x1212eb9), lVar4 < LVar5; local_1cc = local_1cc + 1) {
      local_1d8 = Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::
                  operator[]((Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>
                              *)in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18);
      if ((local_1d8->intent == out) || (local_1d8->intent == inout)) {
        local_1e0 = (FabArrayBase *)local_1d8->orig;
        local_1e8 = &local_1d8->comp_split;
        local_1f0 = &local_1d8->forked;
        if (local_1d8->strategy == split) {
          for (local_1f4 = 0; iVar1 = local_1f4, iVar3 = NTasks((ForkJoin *)0x1212f81),
              iVar1 < iVar3; local_1f4 = local_1f4 + 1) {
            if ((*in_RDI & 1) != 0) {
              OutStream();
              Print::Print(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
              Print::operator<<(in_stack_fffffffffffffa20,(char (*) [11])in_stack_fffffffffffffa18);
              Print::operator<<(in_stack_fffffffffffffa20,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffa18);
              Print::operator<<(in_stack_fffffffffffffa20,(char (*) [2])in_stack_fffffffffffffa18);
              Print::operator<<(in_stack_fffffffffffffa20,(int *)in_stack_fffffffffffffa18);
              Print::operator<<(in_stack_fffffffffffffa20,(char (*) [15])in_stack_fffffffffffffa18);
              Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
              ::operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                            *)in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18);
              Print::operator<<(in_stack_fffffffffffffa20,(int *)in_stack_fffffffffffffa18);
              in_stack_fffffffffffffa90 =
                   Print::operator<<(in_stack_fffffffffffffa20,
                                     (char (*) [3])in_stack_fffffffffffffa18);
              Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
              ::operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                            *)in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18);
              Print::operator<<(in_stack_fffffffffffffa20,(int *)in_stack_fffffffffffffa18);
              Print::operator<<(in_stack_fffffffffffffa20,(char (*) [17])in_stack_fffffffffffffa18);
              Print::operator<<(in_stack_fffffffffffffa20,(int *)in_stack_fffffffffffffa18);
              Print::operator<<(in_stack_fffffffffffffa20,(char (*) [11])in_stack_fffffffffffffa18);
              Print::operator<<(in_stack_fffffffffffffa20,
                                (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                                 *)in_stack_fffffffffffffa18);
              Print::~Print(in_stack_fffffffffffffa90);
            }
            pCVar6 = Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                     ::operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                                   *)in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18)
            ;
            iVar1 = pCVar6->hi;
            pCVar6 = Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                     ::operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                                   *)in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18)
            ;
            local_384 = iVar1 - pCVar6->lo;
            Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                      ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                       in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18);
            Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>::
            operator[]((Vector<amrex::ForkJoin::ComponentSet,_std::allocator<amrex::ForkJoin::ComponentSet>_>
                        *)in_stack_fffffffffffffa20,(size_type)in_stack_fffffffffffffa18);
            FabArray<amrex::FArrayBox>::Redistribute
                      ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffa40,
                       (FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffa38,
                       (int)((ulong)in_stack_fffffffffffffa30 >> 0x20),
                       (int)in_stack_fffffffffffffa30,
                       (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                       (IntVect *)in_stack_fffffffffffffa20);
          }
        }
        else {
          if ((*in_RDI & 1) != 0) {
            OutStream();
            in_stack_fffffffffffffa48 = local_510;
            Print::Print(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
            in_stack_fffffffffffffa50 =
                 Print::operator<<(in_stack_fffffffffffffa20,(char (*) [9])in_stack_fffffffffffffa18
                                  );
            in_stack_fffffffffffffa40 =
                 Print::operator<<(in_stack_fffffffffffffa20,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffa18);
            in_stack_fffffffffffffa38 =
                 Print::operator<<(in_stack_fffffffffffffa20,
                                   (char (*) [16])in_stack_fffffffffffffa18);
            in_stack_fffffffffffffa30 =
                 Print::operator<<(in_stack_fffffffffffffa20,(int *)in_stack_fffffffffffffa18);
            in_stack_fffffffffffffa28 =
                 Print::operator<<(in_stack_fffffffffffffa20,(char (*) [9])in_stack_fffffffffffffa18
                                  );
            Print::operator<<(in_stack_fffffffffffffa20,
                              (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                               *)in_stack_fffffffffffffa18);
            Print::~Print(in_stack_fffffffffffffa90);
          }
          in_stack_fffffffffffffa18 = local_1e0;
          in_stack_fffffffffffffa20 =
               (Print *)Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                                  ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                                   in_stack_fffffffffffffa20,(size_type)local_1e0);
          FabArrayBase::nComp(local_1e0);
          FabArray<amrex::FArrayBox>::Redistribute
                    ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffa40,
                     (FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffa38,
                     (int)((ulong)in_stack_fffffffffffffa30 >> 0x20),(int)in_stack_fffffffffffffa30,
                     (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                     (IntVect *)in_stack_fffffffffffffa20);
        }
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>,_false,_true>
                  *)in_stack_fffffffffffffa20);
  }
  return;
}

Assistant:

void
ForkJoin::copy_data_from_tasks ()
{
    BL_PROFILE("ForkJoin::copy_data_from_tasks()");
    if (flag_verbose) {
        amrex::Print() << "Copying data out of fork-join tasks ...\n";
    }
    for (auto &p : data) { // for each name
        const auto &mf_name = p.first;
        for (int idx = 0; idx < p.second.size(); ++idx) { // for each index
            auto &mff = p.second[idx];
            if (mff.intent == Intent::out || mff.intent == Intent::inout) {
                MultiFab &orig = *mff.orig;
                const auto &comp_split = mff.comp_split;
                const Vector<MultiFab> &forked = mff.forked;
                if (mff.strategy == Strategy::split) {
                    // gather components from across tasks
                    for (int i = 0; i < NTasks(); ++i) {
                        if (flag_verbose) {
                            amrex::Print() << "  Copying " << mf_name << "[" << idx << "] components ["
                                           << comp_split[i].lo << ", " << comp_split[i].hi << ") out from task " << i << " (unsplit)" << std::endl;
                        }
                        int task_comp_n = comp_split[i].hi - comp_split[i].lo;
                        AMREX_ASSERT(forked[i].nComp() == task_comp_n);
                        orig.Redistribute(forked[i], 0, comp_split[i].lo, task_comp_n, mff.ngrow);
                    }
                } else { // mff.strategy == single or duplicate
                    // copy all components from owner_task
                    if (flag_verbose) {
                        amrex::Print() << "Copying " << mf_name << " out from task " << mff.owner_task << " (whole)" << std::endl;
                    }
                    AMREX_ASSERT(forked[mff.owner_task].nComp() == orig.nComp());
                    orig.Redistribute(forked[mff.owner_task], 0, 0, orig.nComp(), mff.ngrow);
                }
            }
        }
    }
}